

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,StringPiece input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseContext *ctx_00;
  undefined1 auVar2 [12];
  char *ptr;
  ParseContext ctx;
  char *local_b8;
  StringPiece local_b0;
  ParseContext local_a0;
  
  ctx_00 = (ParseContext *)input.length_;
  local_b0.length_ = (size_type)input.ptr_;
  local_b0.ptr_ = (char *)this;
  ParseContext::ParseContext<google::protobuf::stringpiece_internal::StringPiece&>
            (&local_a0,io::CodedInputStream::default_recursion_limit_,false,&local_b8,&local_b0);
  auVar2 = (**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x50))
                     (ctx_00,local_b8,&local_a0);
  local_b8 = auVar2._0_8_;
  bVar1 = false;
  if ((local_b8 != (char *)0x0) &&
     (bVar1 = false, local_a0.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) {
    bVar1 = anon_unknown_13::CheckFieldPresence
                      (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),auVar2._8_4_);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(StringPiece input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}